

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

bool __thiscall sf::Font::loadFromStream(Font *this,InputStream *stream)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  FT_Stream_conflict pFVar4;
  unsigned_long uVar5;
  allocator<char> local_91;
  FT_Face_conflict face;
  FT_Stroker stroker;
  FT_Library library;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  FT_Open_Args args;
  
  cleanup(this,(EVP_PKEY_CTX *)stream);
  piVar2 = (int *)operator_new(4);
  *piVar2 = 1;
  this->m_refCount = piVar2;
  iVar1 = FT_Init_FreeType(&library);
  if (iVar1 == 0) {
    this->m_library = library;
    (**(code **)(*(long *)stream + 0x18))(stream,0);
    pFVar4 = (FT_Stream_conflict)operator_new(0x50);
    pFVar4->base = (uchar *)0x0;
    pFVar4->size = 0;
    pFVar4->pos = 0;
    (pFVar4->descriptor).value = 0;
    (pFVar4->pathname).value = 0;
    pFVar4->read = (FT_Stream_IoFunc)0x0;
    pFVar4->close = (FT_Stream_CloseFunc)0x0;
    pFVar4->memory = (FT_Memory)0x0;
    pFVar4->cursor = (uchar *)0x0;
    pFVar4->limit = (uchar *)0x0;
    uVar5 = (**(code **)(*(long *)stream + 0x28))(stream);
    pFVar4->size = uVar5;
    pFVar4->pos = 0;
    (pFVar4->descriptor).pointer = stream;
    pFVar4->read = anon_unknown.dwarf_5c4ce::read;
    pFVar4->close = anon_unknown.dwarf_5c4ce::close;
    args.flags = 2;
    args.driver = (FT_Module)0x0;
    args.stream = pFVar4;
    iVar1 = FT_Open_Face(this->m_library,&args,0,&face);
    if (iVar1 == 0) {
      iVar1 = FT_Stroker_New(this->m_library,&stroker);
      if (iVar1 == 0) {
        iVar1 = FT_Select_Charmap(face,0x756e6963);
        if (iVar1 == 0) {
          this->m_stroker = stroker;
          this->m_face = face;
          this->m_streamRec = pFVar4;
          if (face->family_name == (char *)0x0) {
            local_78 = local_68;
            local_70 = 0;
            local_68[0] = 0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,face->family_name,&local_91);
          }
          std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          return true;
        }
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Failed to load font from stream (failed to set the Unicode character set)"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        FT_Done_Face(face);
        FT_Stroker_Done(stroker);
      }
      else {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,
                                 "Failed to load font from stream (failed to create the stroker)");
        std::endl<char,std::char_traits<char>>(poVar3);
        FT_Done_Face(face);
      }
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,
                               "Failed to load font from stream (failed to create the font face)");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    operator_delete(pFVar4,0x50);
  }
  else {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,
                             "Failed to load font from stream (failed to initialize FreeType)");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool Font::loadFromStream(InputStream& stream)
{
    // Cleanup the previous resources
    cleanup();
    m_refCount = new int(1);

    // Initialize FreeType
    // Note: we initialize FreeType for every font instance in order to avoid having a single
    // global manager that would create a lot of issues regarding creation and destruction order.
    FT_Library library;
    if (FT_Init_FreeType(&library) != 0)
    {
        err() << "Failed to load font from stream (failed to initialize FreeType)" << std::endl;
        return false;
    }
    m_library = library;

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Prepare a wrapper for our stream, that we'll pass to FreeType callbacks
    FT_StreamRec* rec = new FT_StreamRec;
    std::memset(rec, 0, sizeof(*rec));
    rec->base               = NULL;
    rec->size               = static_cast<unsigned long>(stream.getSize());
    rec->pos                = 0;
    rec->descriptor.pointer = &stream;
    rec->read               = &read;
    rec->close              = &close;

    // Setup the FreeType callbacks that will read our stream
    FT_Open_Args args;
    args.flags  = FT_OPEN_STREAM;
    args.stream = rec;
    args.driver = 0;

    // Load the new font face from the specified stream
    FT_Face face;
    if (FT_Open_Face(static_cast<FT_Library>(m_library), &args, 0, &face) != 0)
    {
        err() << "Failed to load font from stream (failed to create the font face)" << std::endl;
        delete rec;
        return false;
    }

    // Load the stroker that will be used to outline the font
    FT_Stroker stroker;
    if (FT_Stroker_New(static_cast<FT_Library>(m_library), &stroker) != 0)
    {
        err() << "Failed to load font from stream (failed to create the stroker)" << std::endl;
        FT_Done_Face(face);
        delete rec;
        return false;
    }

    // Select the Unicode character map
    if (FT_Select_Charmap(face, FT_ENCODING_UNICODE) != 0)
    {
        err() << "Failed to load font from stream (failed to set the Unicode character set)" << std::endl;
        FT_Done_Face(face);
        FT_Stroker_Done(stroker);
        delete rec;
        return false;
    }

    // Store the loaded font in our ugly void* :)
    m_stroker = stroker;
    m_face = face;
    m_streamRec = rec;

    // Store the font information
    m_info.family = face->family_name ? face->family_name : std::string();

    return true;
}